

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O3

void __thiscall qpdf::Tokenizer::inNameHex2(Tokenizer *this,char ch)

{
  byte bVar1;
  uint uVar2;
  char cVar3;
  
  bVar1 = ch - 0x30;
  if (9 < bVar1) {
    if (ch < 'a') {
      if (ch < 'A') goto LAB_002365d3;
      bVar1 = ch - 0x37;
    }
    else {
      bVar1 = ch + 0xa9;
    }
    if (0xf < bVar1) {
LAB_002365d3:
      std::__cxx11::string::_M_replace
                ((ulong)&this->error_message,0,(char *)(this->error_message)._M_string_length,
                 0x2cf29f);
      cVar3 = (char)this + '\x10';
      std::__cxx11::string::push_back(cVar3);
      std::__cxx11::string::push_back(cVar3);
      this->state = st_name;
      inName(this,ch);
      return;
    }
  }
  uVar2 = (uint)bVar1 | this->char_code;
  this->char_code = uVar2;
  if (uVar2 == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&this->error_message,0,(char *)(this->error_message)._M_string_length,0x2cf2cf
              );
    std::__cxx11::string::append((char *)&this->val);
    this->state = st_name;
    this->bad = true;
  }
  else {
    std::__cxx11::string::push_back((char)this + '\x10');
    this->state = st_name;
  }
  return;
}

Assistant:

void
Tokenizer::inNameHex2(char ch)
{
    if (char hval = util::hex_decode_char(ch); hval < '\20') {
        char_code |= int(hval);
    } else {
        QTC::TC("qpdf", "QPDFTokenizer bad name 2");
        error_message = "name with stray # will not work with PDF >= 1.2";
        // Use null to encode a bad # -- this is reversed in QPDF_Name::normalizeName.
        val += '\0';
        val += hex_char;
        state = st_name;
        inName(ch);
        return;
    }
    if (char_code == 0) {
        QTC::TC("qpdf", "QPDFTokenizer null in name");
        error_message = "null character not allowed in name token";
        val += "#00";
        state = st_name;
        bad = true;
    } else {
        val += char(char_code);
        state = st_name;
    }
}